

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_TestCubeTileYsResource_Test::TestBody
          (CTestGen9Resource_TestCubeTileYsResource_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  uint32_t uVar2;
  uint32_t ExpectedValue;
  bool bVar3;
  undefined4 uVar4;
  GMM_RESOURCE_INFO *pGVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint32_t CubeFaceIndex;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  AssertHelper local_58;
  ulong local_50;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  local_f8 = 0;
  uStack_140 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_158 = 4;
  uStack_f0 = 0x100000000;
  uStack_150 = 0x400000000;
  local_148 = 0x5000000000;
  uVar10 = 0;
  psVar1 = &gtest_ar.message_;
  do {
    uVar4 = 0;
    if (uVar10 < 5) {
      uVar4 = (&DAT_001ad00c)[uVar10];
    }
    local_158 = CONCAT44(uVar4,(undefined4)local_158);
    local_128 = 1;
    uStack_120 = 0x100000001;
    pGVar5 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_158);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar5,(&DAT_001ac5d0)[uVar10]);
    local_50 = (ulong)(uint)(&DAT_001ac5f0)[uVar10];
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar5,(&DAT_001ac5f0)[uVar10]);
    uVar2 = (&DAT_001ac610)[uVar10 * 2];
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar5,uVar2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar5,1);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar5,local_50);
    uVar8 = uVar2 * (int)local_50;
    local_50 = (ulong)uVar8;
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar5,(ulong)(uVar8 * 6));
    iVar9 = 0;
    uVar8 = 0;
    do {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      uStack_d8 = 1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar8;
      (**(code **)(*(long *)pGVar5 + 0x68))(pGVar5,&uStack_d8);
      gtest_ar.message_.ptr_._0_4_ = iVar9;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"(CubeFaceIndex * ExpectedQPitch) * ExpectedPitch",
                 "OffsetInfo.Render.Offset64",(uint *)psVar1,(unsigned_long *)&OffsetInfo.Lock.Pitch
                );
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc93,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)psVar1,(uint *)&OffsetInfo.Render);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc94,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.YOffset",(int *)psVar1,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc95,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)psVar1,&OffsetInfo.Render.XOffset);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc96,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar8 = uVar8 + 1;
      iVar9 = iVar9 + (int)local_50;
    } while (uVar8 != 6);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar5);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 5);
  uVar10 = 0;
  psVar1 = &gtest_ar.message_;
  do {
    uVar4 = 0;
    if (uVar10 < 5) {
      uVar4 = (&DAT_001ad00c)[uVar10];
    }
    local_158 = CONCAT44(uVar4,(undefined4)local_158);
    iVar9 = 0;
    uVar6 = 0;
    if (uVar10 < 5) {
      uVar6 = (ulong)(uint)(&DAT_001ad020)[uVar10];
    }
    local_50 = (ulong)(uint)(&DAT_001ac610)[uVar10 * 2];
    uVar8 = (int)(local_50 / uVar6) + 1;
    local_128 = (ulong)uVar8;
    uStack_120 = CONCAT44(1,uVar8);
    pGVar5 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_158,local_50 % uVar6);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar5,(&DAT_001ac5d0)[uVar10]);
    uVar2 = (&DAT_001ac5f0)[uVar10];
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar5,uVar2);
    ExpectedValue = (int)local_50 * 2;
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar5,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar5,2);
    uVar8 = -uVar2 & (uVar2 - 1) + (int)uStack_120;
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar5,(ulong)uVar8);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,pGVar5,(ulong)((int)local_50 * uVar8 * 0xc));
    local_50 = (ulong)(uVar8 * ExpectedValue);
    uVar8 = 0;
    do {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      uStack_d8 = 1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar8;
      (**(code **)(*(long *)pGVar5 + 0x68))(pGVar5,&uStack_d8);
      gtest_ar.message_.ptr_._0_4_ = iVar9;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"(CubeFaceIndex * ExpectedQPitch) * ExpectedPitch",
                 "OffsetInfo.Render.Offset64",(uint *)psVar1,(unsigned_long *)&OffsetInfo.Lock.Pitch
                );
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcbe,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)psVar1,(uint *)&OffsetInfo.Render);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcbf,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.YOffset",(int *)psVar1,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcc0,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)psVar1,&OffsetInfo.Render.XOffset);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)psVar1);
        pcVar7 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcc1,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)psVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar8 = uVar8 + 1;
      iVar9 = iVar9 + (int)local_50;
    } while (uVar8 != 6);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar5);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCubeTileYsResource)
{
    // Cube is allocated as an array of 6 2D surface representing each cube face below
    //===============================
    // �q� coordinate  |    face    |
    //      0          |    + x     |
    //      1          |    - x     |
    //      2          |    + y     |
    //      3          |    - y     |
    //      4          |    + z     |
    //      5          |    - z     |
    //===============================

    const uint32_t HAlign[TEST_BPP_MAX] = {256, 256, 128, 128, 64};
    const uint32_t VAlign[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{256, 256},
                                                {512, 128},
                                                {512, 128},
                                                {1024, 64},
                                                {1024, 64}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_CUBE;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface so that it occupies 1 Tile in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);

        uint32_t ExpectedPitch = TileSize[i][0];
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);      // 1 tile wide

        uint32_t ExpectedQPitch = VAlign[i];
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be VAlign rows apart within a tile

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 __GMM_MAX_CUBE_FACE * ExpectedQPitch);

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);

            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.YOffset); // Y Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension.
    // Width and Height must be equal
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = gmmParams.BaseWidth64;                   // Heigth must be equal to width.
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);

        uint32_t ExpectedPitch = TileSize[i][0] * 2; // As wide as 2 tile
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2); // 2 tile wide

        uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign[i]);
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be Valigned-BaseHeight rows apart

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 __GMM_MAX_CUBE_FACE * ExpectedQPitch);

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.YOffset); // Y Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}